

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

void __thiscall ev3dev::remote_control::~remote_control(remote_control *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__remote_control_00156ca0;
  if (((*(byte *)(in_RDI + 0x1a) & 1) != 0) &&
     (pvVar1 = (void *)in_RDI[0x19], pvVar1 != (void *)0x0)) {
    infrared_sensor::~infrared_sensor((infrared_sensor *)0x13a8a9);
    operator_delete(pvVar1);
  }
  std::function<void_(int)>::~function((function<void_(int)> *)0x13a8c5);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x13a8d6);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x13a8e4);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x13a8f2);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x13a900);
  std::function<void_(bool)>::~function((function<void_(bool)> *)0x13a90e);
  return;
}

Assistant:

remote_control::~remote_control() {
    if (_owns_sensor)
        delete _sensor;
}